

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_Expression_x_iutest_x_Bitwise_Test::Body(iu_Expression_x_iutest_x_Bitwise_Test *this)

{
  char *in_R9;
  int local_218 [2];
  undefined1 local_210 [40];
  undefined1 local_1e8 [44];
  undefined4 local_1bc;
  AssertionResult iutest_ar;
  Fixed local_190;
  
  local_218[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_210,local_218 + 1);
  local_218[0] = 2;
  iutest::detail::ExpressionLHS<int>::operator&<int>
            ((ExpressionLHS<int> *)local_1e8,(ExpressionLHS<int> *)local_210,local_218);
  iutest::detail::ExpressionLHS<int>::GetResult
            ((AssertionResult *)&local_190,(ExpressionLHS<int> *)local_1e8,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)(local_210 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() & 2))","false","true"
               ,in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x47,(char *)local_210._0_8_);
    local_1bc = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_1e8,&local_190);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)local_210);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_218[1] = 0;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_210,local_218 + 1);
  local_218[0] = 1;
  iutest::detail::ExpressionLHS<int>::operator|<int>
            ((ExpressionLHS<int> *)local_1e8,(ExpressionLHS<int> *)local_210,local_218);
  iutest::detail::ExpressionLHS<int>::GetResult
            ((AssertionResult *)&local_190,(ExpressionLHS<int> *)local_1e8,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)(local_210 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((z() | 1))","false","true"
               ,in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x48,(char *)local_210._0_8_);
    local_1bc = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_1e8,&local_190);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::string::~string((string *)local_210);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(Expression, Bitwise)
{
    IUTEST_EXPECT(f() & 2);
    IUTEST_EXPECT(z() | 1);
}